

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O0

int connect_group(in_port_t port,char *addr)

{
  int iVar1;
  undefined1 local_38 [8];
  sockaddr_in local_address;
  ip_mreq ip_mreq;
  u_int yes;
  int sock;
  char *addr_local;
  in_port_t port_local;
  
  iVar1 = socket(2,2,0);
  ip_mreq.imr_interface.s_addr = no_err(iVar1,"socket");
  ip_mreq.imr_multiaddr.s_addr = 1;
  iVar1 = setsockopt(ip_mreq.imr_interface.s_addr,1,0xf,&ip_mreq,4);
  no_err(iVar1,"reuse");
  memset(local_address.sin_zero,0,8);
  local_address.sin_zero._4_4_ = htonl(0);
  iVar1 = inet_aton(addr,(in_addr *)local_address.sin_zero);
  no_err((uint)(iVar1 == 0),"inet_aton");
  iVar1 = setsockopt(ip_mreq.imr_interface.s_addr,0,0x23,local_address.sin_zero,8);
  no_err(iVar1,"setsockopt");
  memset(local_38,0,0x10);
  local_38._0_2_ = 2;
  local_38._4_4_ = htonl(0);
  local_38._2_2_ = htons(port);
  iVar1 = bind(ip_mreq.imr_interface.s_addr,(sockaddr *)local_38,0x10);
  no_err(iVar1,"bind");
  iVar1 = fcntl(ip_mreq.imr_interface.s_addr,4,0x800);
  no_err(iVar1,"set nonblock");
  return ip_mreq.imr_interface.s_addr;
}

Assistant:

int connect_group(in_port_t port, const char *addr) {
  int sock = no_err(socket(AF_INET, SOCK_DGRAM, 0), "socket");
  u_int yes = 1;
  no_err(setsockopt(sock, SOL_SOCKET, SO_REUSEPORT, (char *) &yes, sizeof(yes)), "reuse");
  //Connect to group
  struct ip_mreq ip_mreq{};
  ip_mreq.imr_interface.s_addr = htonl(INADDR_ANY);
  no_err(inet_aton(addr, &ip_mreq.imr_multiaddr) == 0, "inet_aton");
  no_err(setsockopt(sock, IPPROTO_IP, IP_ADD_MEMBERSHIP, (void *) &ip_mreq, sizeof ip_mreq), "setsockopt");
  //Bind to port
  struct sockaddr_in local_address{};
  local_address.sin_family = AF_INET;
  local_address.sin_addr.s_addr = htonl(INADDR_ANY);
  local_address.sin_port = htons(port);
  no_err(bind(sock, (struct sockaddr *) &local_address, sizeof local_address), "bind");
  no_err(fcntl(sock, F_SETFL, O_NONBLOCK), "set nonblock");

  return sock;
}